

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.c
# Opt level: O0

void DrawLine(Bitmap *bitmap,Vector v1,Vector v2,RGBTRIPLE *color)

{
  Vector v1_00;
  Vector v;
  Vector v1_01;
  Vector v2_00;
  Vector v2_01;
  Vector v2_02;
  Vector v1_02;
  longdouble in_ST0;
  undefined8 uVar1;
  undefined8 in_stack_fffffffffffffed8;
  undefined1 local_f8 [60];
  int local_bc;
  undefined8 uStack_b8;
  int i;
  Vector cur;
  Real length;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  Vector unit;
  RGBTRIPLE *color_local;
  Bitmap *bitmap_local;
  
  v1_00.z._8_8_ = v1.x._0_8_;
  v1_00._0_40_ = v2._8_40_;
  v2_00.z._8_8_ = in_stack_fffffffffffffed8;
  v2_00._0_40_ = v1._8_40_;
  uVar1 = v1.x._0_8_;
  VectorSubtraction(v1_00,v2_00);
  v.x._8_8_ = local_68;
  v.x._0_8_ = uStack_70;
  v.y._0_8_ = uStack_60;
  v.y._8_8_ = local_58;
  v.z._0_8_ = uStack_50;
  v.z._8_8_ = uVar1;
  VectorL2Normalization(v);
  v1_02.x._8_8_ = v1.y._0_8_;
  v1_02.x._0_8_ = v1.x._8_8_;
  v1_02.y._0_8_ = v1.y._8_8_;
  v1_02.y._8_8_ = v1.z._0_8_;
  v1_02.z._0_8_ = v1.z._8_8_;
  v1_02.z._8_8_ = v2.x._0_8_;
  v2_01.z._8_8_ = in_stack_fffffffffffffed8;
  v2_01._0_40_ = v2._8_40_;
  VectorEuclideanDistance(v1_02,v2_01);
  unique0x10000e64 = in_ST0;
  memcpy(&stack0xffffffffffffff48,&v1,0x30);
  for (local_bc = 0; (longdouble)local_bc <= stack0xffffffffffffff78; local_bc = local_bc + 1) {
    BitmapSetPixelColor(bitmap,(uint16_t)(int)ROUND((longdouble)CONCAT28(cur.x._0_2_,uStack_b8)),
                        (uint16_t)
                        (int)ROUND((longdouble)(bitmap->dibHeader).bcHeight -
                                   (longdouble)CONCAT28(cur.y._0_2_,cur.x._8_8_)),color);
    v1_01.x._2_6_ = cur.x._2_6_;
    v1_01.x._0_2_ = cur.x._0_2_;
    v1_01.y._2_6_ = cur.y._2_6_;
    v1_01.y._0_2_ = cur.y._0_2_;
    v1_01.x._8_8_ = cur.x._8_8_;
    v1_01.y._8_8_ = cur.y._8_8_;
    v1_01.z._0_8_ = cur.z._0_8_;
    v1_01.z._8_8_ = uStack_48;
    v2_02.x._8_8_ = unit.x._8_8_;
    v2_02.x._0_8_ = unit.x._0_8_;
    v2_02.y._0_8_ = unit.y._0_8_;
    v2_02.y._8_8_ = unit.y._8_8_;
    v2_02.z._0_8_ = unit.z._0_8_;
    v2_02.z._8_8_ = in_stack_fffffffffffffed8;
    VectorAddition(v1_01,v2_02);
    memcpy(&stack0xffffffffffffff48,local_f8,0x30);
  }
  return;
}

Assistant:

void DrawLine(Bitmap *bitmap, const Vector v1, const Vector v2, const RGBTRIPLE *color) {
  Vector unit = VectorL2Normalization(VectorSubtraction(v2, v1));
  Real length = VectorEuclideanDistance(v1, v2);
  Vector cur = v1;
  for (int i = 0; i <= length; ++i) {
    BitmapSetPixelColor(bitmap, cur.x, bitmap->dibHeader.bcHeight - cur.y, color);
    cur = VectorAddition(cur, unit);
  }
}